

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  void *ptr;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  Nonnull<const_char_*> pcVar2;
  undefined8 extraout_RAX;
  ExtensionSet *this_02;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  Arena *local_40 [2];
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_0028760b;
    pcVar2 = (Nonnull<const_char_*>)0x0;
LAB_0028759b:
    if (pcVar2 != (Nonnull<const_char_*>)0x0) {
      AddEnum();
      goto LAB_0028769a;
    }
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      this_02 = (ExtensionSet *)local_40;
      AddEnum(this_02);
      goto LAB_0028762d;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar1->type * 4),8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      if (pEVar1->is_packed == packed) {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                           (pEVar1->is_packed,packed,"extension->is_packed == packed");
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_002876b4;
      goto LAB_002875e8;
    }
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddEnum((ExtensionSet *)local_40);
LAB_0028760b:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,0,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
      goto LAB_0028759b;
    }
    this_02 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (this_02 == (ExtensionSet *)0x8) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
LAB_0028762d:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_02,8,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      pEVar1->is_packed = packed;
      this_00 = this->arena_;
      if (this_00 == (Arena *)0x0) {
        this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
        RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_01,(Arena *)0x0);
      }
      else {
        ptr = Arena::Allocate(this_00,0x10);
        local_40[0] = this_00;
        this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                  Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                  Construct<google::protobuf::Arena*>(ptr,local_40);
      }
      pEVar1->field_0 = this_01;
LAB_002875e8:
      RepeatedField<int>::Add((RepeatedField<int> *)pEVar1->field_0,value);
      return;
    }
LAB_0028769a:
    AddEnum();
  }
  AddEnum();
LAB_002876b4:
  AddEnum();
  operator_delete(this,0x10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}